

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O1

NaTransFunc * __thiscall NaTransFunc::operator+=(NaTransFunc *this,NaTransFunc *tf)

{
  UnionType UVar1;
  UnionType UVar2;
  NaTransFunc *pNVar3;
  undefined8 *puVar4;
  NaTransFunc local_120;
  
  UVar1 = this->ut;
  UVar2 = tf->ut;
  if (UVar1 == utSum && UVar2 == utSum) {
    (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0x13])(this,tf);
  }
  else if (UVar1 == utSum && UVar2 != utSum) {
    pNVar3 = (NaTransFunc *)operator_new(0x108);
    NaTransFunc(pNVar3,tf);
    puVar4 = (undefined8 *)operator_new(8);
    *puVar4 = pNVar3;
    (*(this->items)._vptr_NaDynAr[4])(&this->items,puVar4);
  }
  else if (UVar2 == utSum && UVar1 != utSum) {
    pNVar3 = (NaTransFunc *)operator_new(0x108);
    NaTransFunc(pNVar3,this);
    operator=(this,tf);
    puVar4 = (undefined8 *)operator_new(8);
    *puVar4 = pNVar3;
    (*(this->items)._vptr_NaDynAr[5])(&this->items,puVar4);
  }
  else {
    operator+(&local_120,this,tf);
    operator=(this,&local_120);
    ~NaTransFunc(&local_120);
  }
  return this;
}

Assistant:

NaTransFunc&
NaTransFunc::operator+= (const NaTransFunc& tf)
{
    if(utSum == ut && utSum == tf.ut){
        CopyItems(tf);
    }else if(utSum == ut && utSum != tf.ut){
        items.addh(new NaTransFunc(tf));
    }else if(utSum != ut && utSum == tf.ut){
        NaTransFunc *tf_tmp = new NaTransFunc(*this);
        *this = tf;
        items.addl(tf_tmp);
    }else{ //if(utSum != ut && utSum != tf.ut)
        *this = *this + tf;
    }

    return *this;
}